

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall wasm::FunctionValidator::visitUnary(FunctionValidator *this,Unary *curr)

{
  uint uVar1;
  uint uVar2;
  Type TVar3;
  Type TVar4;
  ValidationInfo *pVVar5;
  char *pcVar6;
  Function *pFVar7;
  bool result;
  
  ValidationInfo::shouldBeUnequal<wasm::Unary*,wasm::Type>
            (this->info,(Type)(curr->value->type).id,(Type)0x0,curr,
             "unaries must not receive a none as their input",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  TVar4.id = (curr->value->type).id;
  if (TVar4.id == 1) {
    return;
  }
  switch(curr->op) {
  case ClzInt32:
  case CtzInt32:
  case PopcntInt32:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "i32 unary value type must be correct";
    goto LAB_009d37d1;
  case ClzInt64:
  case CtzInt64:
  case PopcntInt64:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "i64 unary value type must be correct";
    break;
  case NegFloat32:
  case AbsFloat32:
  case CeilFloat32:
  case FloorFloat32:
  case TruncFloat32:
  case NearestFloat32:
  case SqrtFloat32:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "f32 unary value type must be correct";
    goto LAB_009d3541;
  case NegFloat64:
  case AbsFloat64:
  case CeilFloat64:
  case FloorFloat64:
  case TruncFloat64:
  case NearestFloat64:
  case SqrtFloat64:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "f64 unary value type must be correct";
    goto LAB_009d3522;
  case EqZInt32:
    result = TVar4.id == 2;
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "i32.eqz input must be i32";
    goto LAB_009d374b;
  case EqZInt64:
    result = TVar4.id == 3;
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "i64.eqz input must be i64";
LAB_009d374b:
    ValidationInfo::shouldBeTrue<wasm::Unary*>(pVVar5,result,curr,pcVar6,pFVar7);
    goto switchD_009d3470_default;
  case ExtendSInt32:
  case ExtendUInt32:
  case ExtendS8Int32:
  case ExtendS16Int32:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "extend type must be correct";
    goto LAB_009d37d1;
  case WrapInt64:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "wrap type must be correct";
    break;
  case TruncSFloat32ToInt32:
  case TruncSFloat32ToInt64:
  case TruncUFloat32ToInt32:
  case TruncUFloat32ToInt64:
  case TruncSatSFloat32ToInt32:
  case TruncSatUFloat32ToInt32:
  case TruncSatSFloat32ToInt64:
  case TruncSatUFloat32ToInt64:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "trunc type must be correct";
    goto LAB_009d3541;
  case TruncSFloat64ToInt32:
  case TruncSFloat64ToInt64:
  case TruncUFloat64ToInt32:
  case TruncUFloat64ToInt64:
  case TruncSatSFloat64ToInt32:
  case TruncSatUFloat64ToInt32:
  case TruncSatSFloat64ToInt64:
  case TruncSatUFloat64ToInt64:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "trunc type must be correct";
    goto LAB_009d3522;
  case ReinterpretFloat32:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "reinterpret/f32 type must be correct";
    goto LAB_009d3541;
  case ReinterpretFloat64:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "reinterpret/f64 type must be correct";
    goto LAB_009d3522;
  case ConvertSInt32ToFloat32:
  case ConvertSInt32ToFloat64:
  case ConvertUInt32ToFloat32:
  case ConvertUInt32ToFloat64:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "convert type must be correct";
    goto LAB_009d37d1;
  case ConvertSInt64ToFloat32:
  case ConvertSInt64ToFloat64:
  case ConvertUInt64ToFloat32:
  case ConvertUInt64ToFloat64:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "convert type must be correct";
    break;
  case PromoteFloat32:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "promote type must be correct";
    goto LAB_009d3541;
  case DemoteFloat64:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "demote type must be correct";
    goto LAB_009d3522;
  case ReinterpretInt32:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "reinterpret/i32 type must be correct";
    goto LAB_009d37d1;
  case ReinterpretInt64:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "reinterpret/i64 type must be correct";
    break;
  case ExtendS8Int64:
  case ExtendS16Int64:
  case ExtendS32Int64:
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "extend type must be correct";
    break;
  case SplatVecI8x16:
  case SplatVecI16x8:
  case SplatVecI32x4:
    ValidationInfo::shouldBeEqual<wasm::Unary*,wasm::Type>
              (this->info,
               (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.
                     type.id,(Type)0x6,curr,"expected splat to have v128 type",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    TVar4.id = (curr->value->type).id;
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "expected i32 splat value";
LAB_009d37d1:
    TVar3.id = 2;
    goto LAB_009d37f2;
  case SplatVecI64x2:
    ValidationInfo::shouldBeEqual<wasm::Unary*,wasm::Type>
              (this->info,
               (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.
                     type.id,(Type)0x6,curr,"expected splat to have v128 type",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    TVar4.id = (curr->value->type).id;
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "expected i64 splat value";
    break;
  case SplatVecF32x4:
    ValidationInfo::shouldBeEqual<wasm::Unary*,wasm::Type>
              (this->info,
               (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.
                     type.id,(Type)0x6,curr,"expected splat to have v128 type",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    TVar4.id = (curr->value->type).id;
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "expected f32 splat value";
LAB_009d3541:
    TVar3.id = 4;
    goto LAB_009d37f2;
  case SplatVecF64x2:
    ValidationInfo::shouldBeEqual<wasm::Unary*,wasm::Type>
              (this->info,
               (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.
                     type.id,(Type)0x6,curr,"expected splat to have v128 type",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    TVar4.id = (curr->value->type).id;
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "expected f64 splat value";
LAB_009d3522:
    TVar3.id = 5;
    goto LAB_009d37f2;
  case NotVec128:
  case AbsVecI8x16:
  case NegVecI8x16:
  case PopcntVecI8x16:
  case AbsVecI16x8:
  case NegVecI16x8:
  case AbsVecI32x4:
  case NegVecI32x4:
  case AbsVecI64x2:
  case NegVecI64x2:
  case AbsVecF32x4:
  case NegVecF32x4:
  case SqrtVecF32x4:
  case CeilVecF32x4:
  case FloorVecF32x4:
  case TruncVecF32x4:
  case NearestVecF32x4:
  case AbsVecF64x2:
  case NegVecF64x2:
  case SqrtVecF64x2:
  case CeilVecF64x2:
  case FloorVecF64x2:
  case TruncVecF64x2:
  case NearestVecF64x2:
  case ExtAddPairwiseSVecI8x16ToI16x8:
  case ExtAddPairwiseUVecI8x16ToI16x8:
  case ExtAddPairwiseSVecI16x8ToI32x4:
  case ExtAddPairwiseUVecI16x8ToI32x4:
  case TruncSatSVecF32x4ToVecI32x4:
  case TruncSatUVecF32x4ToVecI32x4:
  case ConvertSVecI32x4ToVecF32x4:
  case ConvertUVecI32x4ToVecF32x4:
  case ExtendLowSVecI8x16ToVecI16x8:
  case ExtendHighSVecI8x16ToVecI16x8:
  case ExtendLowUVecI8x16ToVecI16x8:
  case ExtendHighUVecI8x16ToVecI16x8:
  case ExtendLowSVecI16x8ToVecI32x4:
  case ExtendHighSVecI16x8ToVecI32x4:
  case ExtendLowUVecI16x8ToVecI32x4:
  case ExtendHighUVecI16x8ToVecI32x4:
  case ExtendLowSVecI32x4ToVecI64x2:
  case ExtendHighSVecI32x4ToVecI64x2:
  case ExtendLowUVecI32x4ToVecI64x2:
  case ExtendHighUVecI32x4ToVecI64x2:
  case ConvertLowSVecI32x4ToVecF64x2:
  case ConvertLowUVecI32x4ToVecF64x2:
  case TruncSatZeroSVecF64x2ToVecI32x4:
  case TruncSatZeroUVecF64x2ToVecI32x4:
  case DemoteZeroVecF64x2ToVecF32x4:
  case PromoteLowVecF32x4ToVecF64x2:
  case RelaxedTruncSVecF32x4ToVecI32x4:
  case RelaxedTruncUVecF32x4ToVecI32x4:
  case RelaxedTruncZeroSVecF64x2ToVecI32x4:
  case RelaxedTruncZeroUVecF64x2ToVecI32x4:
    TVar4.id = (curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id;
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "expected v128 type";
    TVar3.id = 6;
    goto LAB_009d3490;
  case AnyTrueVec128:
  case AllTrueVecI8x16:
  case BitmaskVecI8x16:
  case AllTrueVecI16x8:
  case BitmaskVecI16x8:
  case AllTrueVecI32x4:
  case BitmaskVecI32x4:
  case AllTrueVecI64x2:
  case BitmaskVecI64x2:
    TVar4.id = (curr->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id;
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "expected i32 type";
    TVar3.id = 2;
LAB_009d3490:
    ValidationInfo::shouldBeEqual<wasm::Unary*,wasm::Type>(pVVar5,TVar4,TVar3,curr,pcVar6,pFVar7);
    TVar4.id = (curr->value->type).id;
    pFVar7 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction;
    pVVar5 = this->info;
    pcVar6 = "expected v128 operand";
    TVar3.id = 6;
    goto LAB_009d37f2;
  case InvalidUnary:
    handle_unreachable("invalid unary op",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                       ,0x80c);
  default:
    goto switchD_009d3470_default;
  }
  TVar3.id = 3;
LAB_009d37f2:
  ValidationInfo::shouldBeEqual<wasm::Unary*,wasm::Type>(pVVar5,TVar4,TVar3,curr,pcVar6,pFVar7);
switchD_009d3470_default:
  uVar2 = curr->op - ExtendS8Int32;
  uVar1 = 0xffffffff;
  if (uVar2 < 0x3c) {
    uVar1 = *(uint *)(&DAT_00bc0d4c + (ulong)uVar2 * 4);
  }
  ValidationInfo::shouldBeTrue<wasm::Unary*>
            (this->info,
             (uVar1 | (((this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currModule)->features).features) == 0xffffffff,curr,
             "all used features should be allowed",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  return;
}

Assistant:

void FunctionValidator::visitUnary(Unary* curr) {
  shouldBeUnequal(curr->value->type,
                  Type(Type::none),
                  curr,
                  "unaries must not receive a none as their input");
  if (curr->value->type == Type::unreachable) {
    return; // nothing to check
  }
  switch (curr->op) {
    case ClzInt32:
    case CtzInt32:
    case PopcntInt32: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i32),
                    curr,
                    "i32 unary value type must be correct");
      break;
    }
    case ClzInt64:
    case CtzInt64:
    case PopcntInt64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i64),
                    curr,
                    "i64 unary value type must be correct");
      break;
    }
    case NegFloat32:
    case AbsFloat32:
    case CeilFloat32:
    case FloorFloat32:
    case TruncFloat32:
    case NearestFloat32:
    case SqrtFloat32: {
      shouldBeEqual(curr->value->type,
                    Type(Type::f32),
                    curr,
                    "f32 unary value type must be correct");
      break;
    }
    case NegFloat64:
    case AbsFloat64:
    case CeilFloat64:
    case FloorFloat64:
    case TruncFloat64:
    case NearestFloat64:
    case SqrtFloat64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::f64),
                    curr,
                    "f64 unary value type must be correct");
      break;
    }
    case EqZInt32: {
      shouldBeTrue(
        curr->value->type == Type::i32, curr, "i32.eqz input must be i32");
      break;
    }
    case EqZInt64: {
      shouldBeTrue(curr->value->type == Type(Type::i64),
                   curr,
                   "i64.eqz input must be i64");
      break;
    }
    case ExtendSInt32:
    case ExtendUInt32:
    case ExtendS8Int32:
    case ExtendS16Int32: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i32),
                    curr,
                    "extend type must be correct");
      break;
    }
    case ExtendS8Int64:
    case ExtendS16Int64:
    case ExtendS32Int64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i64),
                    curr,
                    "extend type must be correct");
      break;
    }
    case WrapInt64: {
      shouldBeEqual(
        curr->value->type, Type(Type::i64), curr, "wrap type must be correct");
      break;
    }
    case TruncSFloat32ToInt32:
    case TruncSFloat32ToInt64:
    case TruncUFloat32ToInt32:
    case TruncUFloat32ToInt64: {
      shouldBeEqual(
        curr->value->type, Type(Type::f32), curr, "trunc type must be correct");
      break;
    }
    case TruncSatSFloat32ToInt32:
    case TruncSatSFloat32ToInt64:
    case TruncSatUFloat32ToInt32:
    case TruncSatUFloat32ToInt64: {
      shouldBeEqual(
        curr->value->type, Type(Type::f32), curr, "trunc type must be correct");
      break;
    }
    case TruncSFloat64ToInt32:
    case TruncSFloat64ToInt64:
    case TruncUFloat64ToInt32:
    case TruncUFloat64ToInt64: {
      shouldBeEqual(
        curr->value->type, Type(Type::f64), curr, "trunc type must be correct");
      break;
    }
    case TruncSatSFloat64ToInt32:
    case TruncSatSFloat64ToInt64:
    case TruncSatUFloat64ToInt32:
    case TruncSatUFloat64ToInt64: {
      shouldBeEqual(
        curr->value->type, Type(Type::f64), curr, "trunc type must be correct");
      break;
    }
    case ReinterpretFloat32: {
      shouldBeEqual(curr->value->type,
                    Type(Type::f32),
                    curr,
                    "reinterpret/f32 type must be correct");
      break;
    }
    case ReinterpretFloat64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::f64),
                    curr,
                    "reinterpret/f64 type must be correct");
      break;
    }
    case ConvertUInt32ToFloat32:
    case ConvertUInt32ToFloat64:
    case ConvertSInt32ToFloat32:
    case ConvertSInt32ToFloat64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i32),
                    curr,
                    "convert type must be correct");
      break;
    }
    case ConvertUInt64ToFloat32:
    case ConvertUInt64ToFloat64:
    case ConvertSInt64ToFloat32:
    case ConvertSInt64ToFloat64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i64),
                    curr,
                    "convert type must be correct");
      break;
    }
    case PromoteFloat32: {
      shouldBeEqual(curr->value->type,
                    Type(Type::f32),
                    curr,
                    "promote type must be correct");
      break;
    }
    case DemoteFloat64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::f64),
                    curr,
                    "demote type must be correct");
      break;
    }
    case ReinterpretInt32: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i32),
                    curr,
                    "reinterpret/i32 type must be correct");
      break;
    }
    case ReinterpretInt64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i64),
                    curr,
                    "reinterpret/i64 type must be correct");
      break;
    }
    case SplatVecI8x16:
    case SplatVecI16x8:
    case SplatVecI32x4:
      shouldBeEqual(
        curr->type, Type(Type::v128), curr, "expected splat to have v128 type");
      shouldBeEqual(
        curr->value->type, Type(Type::i32), curr, "expected i32 splat value");
      break;
    case SplatVecI64x2:
      shouldBeEqual(
        curr->type, Type(Type::v128), curr, "expected splat to have v128 type");
      shouldBeEqual(
        curr->value->type, Type(Type::i64), curr, "expected i64 splat value");
      break;
    case SplatVecF32x4:
      shouldBeEqual(
        curr->type, Type(Type::v128), curr, "expected splat to have v128 type");
      shouldBeEqual(
        curr->value->type, Type(Type::f32), curr, "expected f32 splat value");
      break;
    case SplatVecF64x2:
      shouldBeEqual(
        curr->type, Type(Type::v128), curr, "expected splat to have v128 type");
      shouldBeEqual(
        curr->value->type, Type(Type::f64), curr, "expected f64 splat value");
      break;
    case NotVec128:
    case PopcntVecI8x16:
    case AbsVecI8x16:
    case AbsVecI16x8:
    case AbsVecI32x4:
    case AbsVecI64x2:
    case NegVecI8x16:
    case NegVecI16x8:
    case NegVecI32x4:
    case NegVecI64x2:
    case AbsVecF32x4:
    case NegVecF32x4:
    case SqrtVecF32x4:
    case CeilVecF32x4:
    case FloorVecF32x4:
    case TruncVecF32x4:
    case NearestVecF32x4:
    case AbsVecF64x2:
    case NegVecF64x2:
    case SqrtVecF64x2:
    case CeilVecF64x2:
    case FloorVecF64x2:
    case TruncVecF64x2:
    case NearestVecF64x2:
    case ExtAddPairwiseSVecI8x16ToI16x8:
    case ExtAddPairwiseUVecI8x16ToI16x8:
    case ExtAddPairwiseSVecI16x8ToI32x4:
    case ExtAddPairwiseUVecI16x8ToI32x4:
    case TruncSatSVecF32x4ToVecI32x4:
    case TruncSatUVecF32x4ToVecI32x4:
    case ConvertSVecI32x4ToVecF32x4:
    case ConvertUVecI32x4ToVecF32x4:
    case ExtendLowSVecI8x16ToVecI16x8:
    case ExtendHighSVecI8x16ToVecI16x8:
    case ExtendLowUVecI8x16ToVecI16x8:
    case ExtendHighUVecI8x16ToVecI16x8:
    case ExtendLowSVecI16x8ToVecI32x4:
    case ExtendHighSVecI16x8ToVecI32x4:
    case ExtendLowUVecI16x8ToVecI32x4:
    case ExtendHighUVecI16x8ToVecI32x4:
    case ExtendLowSVecI32x4ToVecI64x2:
    case ExtendHighSVecI32x4ToVecI64x2:
    case ExtendLowUVecI32x4ToVecI64x2:
    case ExtendHighUVecI32x4ToVecI64x2:
    case ConvertLowSVecI32x4ToVecF64x2:
    case ConvertLowUVecI32x4ToVecF64x2:
    case TruncSatZeroSVecF64x2ToVecI32x4:
    case TruncSatZeroUVecF64x2ToVecI32x4:
    case DemoteZeroVecF64x2ToVecF32x4:
    case PromoteLowVecF32x4ToVecF64x2:
    case RelaxedTruncSVecF32x4ToVecI32x4:
    case RelaxedTruncUVecF32x4ToVecI32x4:
    case RelaxedTruncZeroSVecF64x2ToVecI32x4:
    case RelaxedTruncZeroUVecF64x2ToVecI32x4:
      shouldBeEqual(curr->type, Type(Type::v128), curr, "expected v128 type");
      shouldBeEqual(
        curr->value->type, Type(Type::v128), curr, "expected v128 operand");
      break;
    case AnyTrueVec128:
    case AllTrueVecI8x16:
    case AllTrueVecI16x8:
    case AllTrueVecI32x4:
    case AllTrueVecI64x2:
    case BitmaskVecI8x16:
    case BitmaskVecI16x8:
    case BitmaskVecI32x4:
    case BitmaskVecI64x2:
      shouldBeEqual(curr->type, Type(Type::i32), curr, "expected i32 type");
      shouldBeEqual(
        curr->value->type, Type(Type::v128), curr, "expected v128 operand");
      break;
    case InvalidUnary:
      WASM_UNREACHABLE("invalid unary op");
  }
  shouldBeTrue(Features::get(curr->op) <= getModule()->features,
               curr,
               "all used features should be allowed");
}